

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<ghc::filesystem::path_const&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,path *args)

{
  format_args args_00;
  string_view fmt_00;
  char *s;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_stack_00000010;
  log_msg *in_stack_00000018;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffb00;
  logger *in_stack_fffffffffffffb08;
  logger *in_stack_fffffffffffffb10;
  basic_appender<char> *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffb48;
  level_enum lvl_00;
  log_msg *in_stack_fffffffffffffb70;
  string_view_t in_stack_fffffffffffffb78;
  string_view_t in_stack_fffffffffffffb88;
  source_loc in_stack_fffffffffffffba0;
  basic_string_view<char> local_3f8 [2];
  undefined2 uStack_3ca;
  log_msg *local_3c8;
  buffer<char> *local_360;
  char *local_358;
  size_t local_350;
  undefined8 local_348;
  char **local_340;
  undefined8 local_338;
  undefined8 local_330;
  basic_appender<char> local_328 [4];
  buffer<char> local_308 [9];
  undefined1 local_1e2;
  byte local_1e1;
  undefined8 local_1e0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_f0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_e8;
  char **local_d8;
  undefined8 *local_d0;
  undefined8 local_10;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *local_8;
  
  lvl_00 = (level_enum)((ulong)in_RDI >> 0x20);
  local_1e0 = in_R8;
  local_1c8 = in_RDX;
  local_1c0 = in_RCX;
  local_1e1 = should_log(in_stack_fffffffffffffb08,
                         (level_enum)((ulong)in_stack_fffffffffffffb00 >> 0x20));
  local_1e2 = details::backtracer::enabled((backtracer *)0x166c3b);
  if (((local_1e1 & 1) != 0) || ((bool)local_1e2)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffb00,(allocator<char> *)in_stack_fffffffffffffaf8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_328,local_308);
    local_338 = local_1c8;
    local_330 = local_1c0;
    local_f0 = local_1e0;
    local_8 = &local_e8;
    local_10 = local_1e0;
    ::fmt::v11::detail::value<fmt::v11::context>::value<const_ghc::filesystem::path,_0>
              ((value<fmt::v11::context> *)local_8,local_1e0);
    local_358 = (char *)local_e8.long_long_value;
    local_350 = local_e8.string.size;
    local_d0 = &local_348;
    local_d8 = &local_358;
    local_348 = 0xf;
    fmt_00.size_ = local_e8.string.size;
    fmt_00.data_ = (char *)local_e8.long_long_value;
    args_00.desc_._4_4_ = in_stack_fffffffffffffb44;
    args_00.desc_._0_4_ = in_stack_fffffffffffffb40;
    args_00.field_1.values_ = in_stack_fffffffffffffb48.values_;
    local_340 = local_d8;
    local_360 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffb38,fmt_00,args_00);
    local_3c8 = in_stack_00000018;
    uStack_3ca = (undefined2)((ulong)in_stack_00000010 >> 0x30);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    s = ::fmt::v11::detail::buffer<char>::data(local_308);
    count = ::fmt::v11::detail::buffer<char>::size(local_308);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_3f8,s,count);
    details::log_msg::log_msg
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffba0,in_stack_fffffffffffffb88,lvl_00,
               in_stack_fffffffffffffb78);
    log_it_(in_stack_fffffffffffffb10,local_3c8,SUB21((ushort)uStack_3ca >> 8,0),SUB21(uStack_3ca,0)
           );
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x166e97);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }